

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

HTMLElement * __thiscall choc::html::HTMLElement::addLink(HTMLElement *this,string_view linkURL)

{
  HTMLElement *pHVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"a",&local_61);
  pHVar1 = addChild(this,&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"href",&local_62);
  pHVar1 = setProperty(pHVar1,&local_60,linkURL);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return pHVar1;
}

Assistant:

HTMLElement& addLink (std::string_view linkURL)     { return addChild ("a").setProperty ("href", linkURL); }